

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbePmaReadVarint(PmaReader *p,u64 *pnOut)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  long lVar4;
  u8 *p_00;
  uint uVar5;
  u8 *a;
  u8 aVarint [16];
  uchar *local_40;
  uchar local_38 [24];
  
  if (p->aMap == (u8 *)0x0) {
    lVar4 = p->iReadOff % (long)p->nBuffer;
    if (p->nBuffer - (int)lVar4 < 9 || lVar4 == 0) {
      uVar5 = 0;
      do {
        iVar3 = vdbePmaReadBlob(p,1,&local_40);
        if (iVar3 != 0) {
          return iVar3;
        }
        uVar1 = *local_40;
        local_38[uVar5 & 0xf] = uVar1;
        uVar5 = uVar5 + 1;
      } while ((char)uVar1 < '\0');
      sqlite3GetVarint(local_38,pnOut);
      return 0;
    }
    p_00 = p->aBuffer + lVar4;
  }
  else {
    p_00 = p->aMap + p->iReadOff;
  }
  bVar2 = sqlite3GetVarint(p_00,pnOut);
  p->iReadOff = p->iReadOff + (ulong)bVar2;
  return 0;
}

Assistant:

static int vdbePmaReadVarint(PmaReader *p, u64 *pnOut){
  int iBuf;

  if( p->aMap ){
    p->iReadOff += sqlite3GetVarint(&p->aMap[p->iReadOff], pnOut);
  }else{
    iBuf = p->iReadOff % p->nBuffer;
    if( iBuf && (p->nBuffer-iBuf)>=9 ){
      p->iReadOff += sqlite3GetVarint(&p->aBuffer[iBuf], pnOut);
    }else{
      u8 aVarint[16], *a;
      int i = 0, rc;
      do{
        rc = vdbePmaReadBlob(p, 1, &a);
        if( rc ) return rc;
        aVarint[(i++)&0xf] = a[0];
      }while( (a[0]&0x80)!=0 );
      sqlite3GetVarint(aVarint, pnOut);
    }
  }

  return SQLITE_OK;
}